

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderOperatorTests.cpp
# Opt level: O0

void vkt::sr::anon_unknown_0::eval_leftShiftVecScalar_uvec4(ShaderEvalContext *c)

{
  float *pfVar1;
  Vector<float,_4> local_50;
  Vector<float,_4> local_40;
  _anonymous_namespace_ local_30 [16];
  Vector<unsigned_int,_4> local_20;
  ShaderEvalContext *local_10;
  ShaderEvalContext *c_local;
  
  local_10 = c;
  tcu::Vector<float,_4>::swizzle(&local_50,(int)c + 0x30,1,2,3);
  tcu::Vector<float,_4>::asUint(&local_40);
  pfVar1 = tcu::Vector<float,_4>::x(local_10->in + 1);
  sr::(anonymous_namespace)::leftShiftVecScalar<unsigned_int,4>
            (local_30,(Vector<unsigned_int,_4> *)&local_40,(int)*pfVar1);
  tcu::Vector<unsigned_int,_4>::asFloat(&local_20);
  *(undefined8 *)(local_10->color).m_data = local_20.m_data._0_8_;
  *(undefined8 *)((local_10->color).m_data + 2) = local_20.m_data._8_8_;
  return;
}

Assistant:

void eval_selection_uint	(ShaderEvalContext& c) { c.color.x()	= (float)selection(c.in[0].z() > 0.0f,	(deUint32)c.in[1].x(),					(deUint32)c.in[2].y()); }